

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O2

wstring * __thiscall
Excel::loadString_abi_cxx11_
          (wstring *__return_storage_ptr__,Excel *this,Stream *stream,
          vector<int,_std::allocator<int>_> *borders,int32_t lengthFieldSize,BiffVersion biffVer)

{
  bool bVar1;
  int32_t pos;
  Exception *this_00;
  int32_t bytes;
  size_t i_1;
  size_type sVar2;
  long lVar3;
  int16_t i;
  long lVar4;
  size_t dummySize;
  size_type sVar5;
  char options;
  allocator_type local_79;
  int16_t formattingRuns;
  int16_t charactersCount;
  int32_t extStringLength;
  vector<char,_std::allocator<char>_> dummy;
  vector<unsigned_short,_std::allocator<unsigned_short>_> stringData;
  
  charactersCount = 0;
  formattingRuns = 0;
  options = '\0';
  extStringLength = 0;
  Stream::read<short>((Stream *)this,&charactersCount,(int32_t)borders);
  if (charactersCount < 0x100 || lengthFieldSize != 0x500) {
    if (lengthFieldSize == 0x600) {
      Stream::read<char>((Stream *)this,&options,1);
      if ((options & 8U) != 0) {
        Stream::read<short>((Stream *)this,&formattingRuns,2);
      }
      if ((options & 4U) != 0) {
        Stream::read<int>((Stream *)this,&extStringLength,4);
      }
      bytes = (options & 1) + 1;
    }
    else {
      bytes = 1;
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&stringData,(long)charactersCount,(allocator_type *)&dummy);
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < charactersCount; lVar4 = lVar4 + 1) {
      pos = (**(code **)(*(long *)this + 0x28))(this);
      bVar1 = isSkipByte(pos,(vector<int,_std::allocator<int>_> *)stream);
      if (bVar1) {
        Stream::read<char>((Stream *)this,&options,1);
        bytes = 1;
        if (lengthFieldSize == 0x600) {
          bytes = ((byte)options & 1) + 1;
        }
      }
      Stream::read<unsigned_short>
                ((Stream *)this,
                 (unsigned_short *)
                 ((long)stringData.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar3),bytes);
      lVar3 = lVar3 + 2;
    }
    if (0 < (long)formattingRuns) {
      sVar5 = (long)formattingRuns * 4;
      std::vector<char,_std::allocator<char>_>::vector(&dummy,sVar5,&local_79);
      for (sVar2 = 0; sVar5 != sVar2; sVar2 = sVar2 + 1) {
        Stream::read<char>((Stream *)this,
                           dummy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start + sVar2,1);
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&dummy.super__Vector_base<char,_std::allocator<char>_>);
    }
    sVar2 = (size_type)extStringLength;
    if (0 < (long)sVar2) {
      std::vector<char,_std::allocator<char>_>::vector(&dummy,sVar2,&local_79);
      for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
        Stream::read<char>((Stream *)this,
                           dummy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start + sVar5,1);
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&dummy.super__Vector_base<char,_std::allocator<char>_>);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
    std::__cxx11::wstring::
    assign<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,void>
              ((wstring *)__return_storage_ptr__,
               (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                )stringData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                )stringData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&stringData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    return __return_storage_ptr__;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  std::__cxx11::wstring::wstring
            ((wstring *)&stringData,L"Wrong format of XLS file.",(allocator *)&dummy);
  Exception::Exception(this_00,(wstring *)&stringData);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline std::wstring
loadString( Stream & stream,
	const std::vector< int32_t > & borders,
	int32_t lengthFieldSize = 2,
	BOF::BiffVersion biffVer = BOF::BIFF8 )
{
	int16_t charactersCount = 0;
	char options = 0;
	int16_t formattingRuns = 0;
	int32_t extStringLength = 0;

	stream.read( charactersCount, lengthFieldSize );

	if( biffVer == BOF::BIFF7 && charactersCount > 255 )
		throw Exception( L"Wrong format of XLS file." );

	if( biffVer == BOF::BIFF8 )
	{
		stream.read( options, 1 );

		if( isRichString( options ) )
			stream.read( formattingRuns, 2 );

		if( isExtString( options ) )
			stream.read( extStringLength, 4 );
	}

	int16_t bytesPerChar = ( biffVer == BOF::BIFF8 ? ( isHighByte( options ) ? 2 : 1 ) : 1 );

	std::vector< uint16_t > stringData( charactersCount );

	for( int16_t i = 0; i < charactersCount; ++i )
	{
		if( isSkipByte( stream.pos(), borders ) )
		{
			stream.read( options, 1 );
			bytesPerChar = ( biffVer == BOF::BIFF8 ? ( isHighByte( options ) ? 2 : 1 ) : 1 );
		}

		stream.read( stringData[ i ], bytesPerChar );
	}

	if( formattingRuns > 0 )
	{
		const size_t dummySize = formattingRuns * 4;
		std::vector< char > dummy( dummySize );

		for( size_t i = 0; i < dummySize; ++i )
			stream.read( dummy[ i ], 1 );
	}

	if( extStringLength > 0 )
	{
		const size_t dummySize = extStringLength;
		std::vector< char > dummy( dummySize );

		for( size_t i = 0; i < dummySize; ++i )
			stream.read( dummy[ i ], 1 );
	}

	std::wstring str;
	str.assign( stringData.begin(), stringData.end() );

	return str;
}